

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall
dxil_spv::CFGStructurizer::hoist_switch_branches_to_frontier
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge,CFGNode *dominance_frontier_candidate)

{
  pointer *pppOVar1;
  CFGNode **__src;
  pointer *pppCVar2;
  pointer ppOVar3;
  SPIRVModule *this_00;
  iterator __position;
  pointer ppCVar4;
  pointer pCVar5;
  CFGNode **ppCVar6;
  pointer pPVar7;
  pointer pIVar8;
  pointer ppOVar9;
  pointer ppOVar10;
  Case *pCVar11;
  uint32_t id;
  Id IVar12;
  PHI *phi;
  CFGNode *insert_node;
  Operation *pOVar13;
  Builder *this_01;
  pointer ppCVar14;
  pointer pCVar15;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __dest;
  pointer pPVar16;
  pointer pIVar17;
  Case *c;
  Case *c_00;
  Case *pCVar18;
  bool bVar19;
  CFGNode *succ;
  Operation *bor;
  Vector<CFGNode_*> succs;
  CFGNode *local_a0;
  Operation *local_98;
  Id local_8c;
  pointer local_88;
  CFGNode *local_80;
  pointer local_78;
  Case *local_70;
  CFGNode *local_68;
  vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *local_60;
  CFGStructurizer *local_58;
  Operation *local_50;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_48;
  
  local_80 = merge;
  insert_node = create_helper_pred_block(this,node);
  ppOVar9 = (insert_node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar10 = (insert_node->ir).operations.
             super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppOVar3 = (insert_node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (insert_node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (insert_node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (insert_node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppOVar9;
  (node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppOVar10;
  (node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppOVar3;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&local_48,&node->succ);
  local_88 = local_48.
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_60 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
               &(insert_node->ir).operations;
    ppCVar14 = local_48.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_68 = dominance_frontier_candidate;
    local_58 = this;
    do {
      while( true ) {
        local_78 = ppCVar14;
        local_a0 = *local_78;
        if (local_a0 == dominance_frontier_candidate) {
          bVar19 = true;
        }
        else {
          bVar19 = ((this->reachability_bitset).
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(ulong)(this->reachability_stride * local_a0->forward_post_visit_order) +
                     (ulong)(dominance_frontier_candidate->forward_post_visit_order >> 5)] >>
                    (dominance_frontier_candidate->forward_post_visit_order & 0x1f) & 1) != 0;
        }
        if (!bVar19) break;
        c_00 = (node->ir).terminator.cases.
               super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
               ._M_impl.super__Vector_impl_data._M_start;
        pCVar18 = (node->ir).terminator.cases.
                  super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        IVar12 = 0;
        pCVar11 = pCVar18;
        if (c_00 != pCVar18) {
          do {
            local_70 = pCVar11;
            if (c_00->node == local_a0) {
              pOVar13 = build_switch_case_equal_check(this,node,insert_node,c_00);
              if (IVar12 == 0) {
                IVar12 = pOVar13->id;
              }
              else {
                this_00 = this->module;
                local_50 = pOVar13;
                id = SPIRVModule::allocate_id(this_00);
                local_8c = IVar12;
                this_01 = SPIRVModule::get_builder(this->module);
                IVar12 = spv::Builder::makeBoolType(this_01);
                local_98 = SPIRVModule::allocate_op(this_00,OpLogicalOr,id,IVar12);
                Operation::add_id(local_98,local_8c);
                Operation::add_id(local_98,local_50->id);
                __position._M_current =
                     (insert_node->ir).operations.
                     super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (insert_node->ir).operations.
                    super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>
                  ::_M_realloc_insert<dxil_spv::Operation*const&>(local_60,__position,&local_98);
                }
                else {
                  *__position._M_current = local_98;
                  pppOVar1 = &(insert_node->ir).operations.
                              super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppOVar1 = *pppOVar1 + 1;
                }
                IVar12 = local_98->id;
                this = local_58;
                pCVar18 = local_70;
              }
            }
            c_00 = c_00 + 1;
            pCVar11 = local_70;
          } while (c_00 != pCVar18);
        }
        dominance_frontier_candidate = local_68;
        if (local_a0 == local_68) {
          pPVar7 = (local_68->ir).phi.
                   super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar16 = (local_68->ir).phi.
                         super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar16 != pPVar7;
              pPVar16 = pPVar16 + 1) {
            pIVar8 = (pPVar16->incoming).
                     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pIVar17 = (pPVar16->incoming).
                           super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                           ._M_impl.super__Vector_impl_data._M_start; pIVar17 != pIVar8;
                pIVar17 = pIVar17 + 1) {
              if (pIVar17->block == node) {
                pIVar17->block = insert_node;
              }
            }
          }
        }
        ppCVar4 = (local_a0->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar14 = (local_a0->pred).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppCVar14 != ppCVar4;
            ppCVar14 = ppCVar14 + 1) {
          if (*ppCVar14 == node) {
            *ppCVar14 = insert_node;
          }
        }
        pCVar5 = (node->ir).terminator.cases.
                 super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar15 = (node->ir).terminator.cases.
                       super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar15 != pCVar5;
            pCVar15 = pCVar15 + 1) {
          if (pCVar15->node == local_a0) {
            pCVar15->node = local_80;
          }
        }
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                           ((node->succ).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (node->succ).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
        __src = __dest._M_current + 1;
        ppCVar6 = (node->succ).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppCVar6) {
          memmove(__dest._M_current,__src,(long)ppCVar6 - (long)__src);
        }
        pppCVar2 = &(node->succ).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar2 = *pppCVar2 + -1;
        CFGNode::add_branch(node,local_80);
        CFGNode::add_branch(insert_node,local_a0);
        if (local_a0 == dominance_frontier_candidate) {
          local_a0 = CFGNode::rewrite_branch_through_intermediate_node
                               (insert_node,dominance_frontier_candidate,
                                dominance_frontier_candidate);
        }
        (insert_node->ir).terminator.type = Condition;
        (insert_node->ir).terminator.conditional_id = IVar12;
        (insert_node->ir).terminator.true_block = local_a0;
        (insert_node->ir).terminator.false_block = node;
        (insert_node->ir).terminator.direct_block = (CFGNode *)0x0;
        ppCVar14 = local_78 + 1;
        if (bVar19 || local_78 + 1 == local_88) goto LAB_00107008;
      }
      ppCVar14 = local_78 + 1;
    } while (local_78 + 1 != local_88);
  }
LAB_00107008:
  if (local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_48.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CFGStructurizer::hoist_switch_branches_to_frontier(CFGNode *node, CFGNode *merge,
                                                        CFGNode *dominance_frontier_candidate)
{
	// Dispatch to the dominance frontier before we enter switch scope.
	auto *pred = create_helper_pred_block(node);
	std::swap(pred->ir.operations, node->ir.operations);

	auto succs = node->succ;
	for (auto *succ : succs)
	{
		if (!query_reachability(*succ, *dominance_frontier_candidate))
			continue;

		// Rewrite the case label to reach merge block in a unique path.
		// That way we can PHI select whether to branch to dominance frontier or not
		// in the switch merge block.

		spv::Id cond_id = 0;
		for (auto &c : node->ir.terminator.cases)
		{
			if (c.node == succ)
			{
				auto *ieq = build_switch_case_equal_check(node, pred, c);

				if (cond_id)
				{
					auto *bor = module.allocate_op(spv::OpLogicalOr, module.allocate_id(),
					                               module.get_builder().makeBoolType());
					bor->add_id(cond_id);
					bor->add_id(ieq->id);
					pred->ir.operations.push_back(bor);
					cond_id = bor->id;
				}
				else
				{
					cond_id = ieq->id;
				}
			}
		}

		if (succ == dominance_frontier_candidate)
		{
			// We're directly branching to target, so might have to rewrite PHI incoming
			// block to pred helper block instead.
			for (auto &phi : dominance_frontier_candidate->ir.phi)
				for (auto &incoming : phi.incoming)
					if (incoming.block == node)
						incoming.block = pred;
		}

		for (auto *&p : succ->pred)
			if (p == node)
				p = pred;

		for (auto &c : node->ir.terminator.cases)
			if (c.node == succ)
				c.node = merge;

		node->succ.erase(std::find(node->succ.begin(), node->succ.end(), succ));
		node->add_branch(merge);
		pred->add_branch(succ);

		// Make sure that our selection branch has somewhere to merge if it has to.
		if (succ == dominance_frontier_candidate)
		{
			succ = pred->rewrite_branch_through_intermediate_node(dominance_frontier_candidate,
			                                                      dominance_frontier_candidate);
		}

		pred->ir.terminator.type = Terminator::Type::Condition;
		pred->ir.terminator.conditional_id = cond_id;
		pred->ir.terminator.true_block = succ;
		pred->ir.terminator.false_block = node;
		pred->ir.terminator.direct_block = nullptr;

		// Have to assume that there is only one path to this frontier,
		// otherwise we're in a world of impossible case merges
		// which should have been handled elsewhere ...
		return;
	}
}